

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O0

void strings_equal<wchar_t>
               (string *n_c,string *n_s,string *n_p,int n,string *iexpected,locale *l,string *domain
               )

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined8 uVar6;
  runtime_error *this;
  int iVar7;
  locale *in_R9;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> ss_2;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> ss_1;
  locale tmp_locale;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> ss;
  string_type tmp;
  locale tmp_locale_1;
  wchar_t *p_c_str;
  wchar_t *s_c_str;
  wchar_t *c_c_str;
  string_type p;
  string_type s;
  string_type c;
  string_type expected;
  basic_message<wchar_t> *in_stack_fffffffffffff088;
  basic_message<wchar_t> *in_stack_fffffffffffff090;
  basic_message<wchar_t> *in_stack_fffffffffffff098;
  string *s_00;
  runtime_error *in_stack_fffffffffffff0a0;
  string *in_stack_fffffffffffff0a8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffff0b0;
  undefined7 in_stack_fffffffffffff0b8;
  undefined1 in_stack_fffffffffffff0bf;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *in_stack_fffffffffffff0c0;
  string *in_stack_fffffffffffff0d0;
  basic_message<wchar_t> *in_stack_fffffffffffff0d8;
  locale *in_stack_fffffffffffff0e0;
  allocator *paVar8;
  string *in_stack_fffffffffffff0e8;
  undefined1 local_d49 [33];
  wstring local_d28 [192];
  locale local_c68;
  wostringstream local_c60 [382];
  undefined1 local_ae2;
  allocator local_ae1;
  string local_ae0 [32];
  wstring local_ac0 [192];
  locale local_a00;
  wostringstream local_9f8 [376];
  locale local_880;
  undefined1 local_872;
  allocator local_871;
  string local_870 [160];
  wstring local_7d0 [32];
  locale local_7b0;
  locale local_7a8;
  undefined1 local_79a;
  allocator local_799;
  string local_798 [160];
  wstring local_6f8 [38];
  undefined1 local_6d2;
  allocator local_6d1;
  string local_6d0 [32];
  wstring local_6b0 [160];
  locale local_610;
  wostringstream local_608 [376];
  locale local_490;
  undefined1 local_482;
  allocator local_481;
  string local_480 [160];
  wstring local_3e0 [38];
  undefined1 local_3ba;
  allocator local_3b9;
  string local_3b8 [160];
  wstring local_318 [32];
  locale local_2f8;
  locale local_2f0;
  undefined1 local_2e2;
  allocator local_2e1;
  string local_2e0 [160];
  wstring local_240 [32];
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined1 local_202;
  allocator local_201;
  string local_200 [160];
  wstring local_160 [39];
  allocator local_139;
  string local_138 [32];
  wstring local_118 [39];
  allocator local_f1;
  string local_f0 [32];
  wstring local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  wstring local_88 [48];
  locale local_58;
  wstring local_50 [80];
  
  std::locale::locale(&local_58,in_R9);
  to_correct_string<wchar_t>(in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
  std::locale::~locale(&local_58);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,pcVar4,&local_a9);
  to<wchar_t>((string *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,pcVar4,&local_f1);
  to<wchar_t>((string *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,pcVar4,&local_139);
  to<wchar_t>((string *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff090,(char *)in_stack_fffffffffffff088);
  if (bVar1) {
    test_counter = test_counter + 1;
    booster::locale::translate<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff0a8,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff0a0,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff098,(int)((ulong)in_stack_fffffffffffff090 >> 0x20));
    booster::locale::basic_message<wchar_t>::str_abi_cxx11_
              (in_stack_fffffffffffff098,(locale *)in_stack_fffffffffffff090);
    _Var2 = std::operator==(in_stack_fffffffffffff0b0,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)in_stack_fffffffffffff0a8);
    std::__cxx11::wstring::~wstring(local_160);
    booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff090);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4f);
      poVar5 = std::operator<<(poVar5," bl::translate(c,s,p,n).str(l)==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_202 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_200,"Error limits reached, stopping unit test",&local_201);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff0a0,(string *)in_stack_fffffffffffff098);
        local_202 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    local_210 = std::__cxx11::wstring::c_str();
    local_218 = std::__cxx11::wstring::c_str();
    local_220 = std::__cxx11::wstring::c_str();
    test_counter = test_counter + 1;
    booster::locale::translate<wchar_t>
              ((wchar_t *)in_stack_fffffffffffff0a8,(wchar_t *)in_stack_fffffffffffff0a0,
               &in_stack_fffffffffffff098->n_,(int)((ulong)in_stack_fffffffffffff090 >> 0x20));
    booster::locale::basic_message<wchar_t>::str_abi_cxx11_
              (in_stack_fffffffffffff098,(locale *)in_stack_fffffffffffff090);
    _Var2 = std::operator==(in_stack_fffffffffffff0b0,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)in_stack_fffffffffffff0a8);
    std::__cxx11::wstring::~wstring(local_240);
    booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff090);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x51);
      poVar5 = std::operator<<(poVar5," bl::translate(c_c_str,s_c_str,p_c_str,n).str(l)==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_2e2 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_2e0,"Error limits reached, stopping unit test",&local_2e1);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff0a0,(string *)in_stack_fffffffffffff098);
        local_2e2 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    std::locale::locale(&local_2f0);
    std::locale::global(&local_2f8);
    std::locale::~locale(&local_2f8);
    booster::locale::translate<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff0a8,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff0a0,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff098,(int)((ulong)in_stack_fffffffffffff090 >> 0x20));
    booster::locale::basic_message::operator_cast_to_wstring(in_stack_fffffffffffff088);
    booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff090);
    test_counter = test_counter + 1;
    _Var2 = std::operator==(in_stack_fffffffffffff0b0,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)in_stack_fffffffffffff0a8);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x55);
      poVar5 = std::operator<<(poVar5," tmp==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_3ba = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3b8,"Error limits reached, stopping unit test",&local_3b9);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff0a0,(string *)in_stack_fffffffffffff098);
        local_3ba = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    booster::locale::translate<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff0a8,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff0a0,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff098,(int)((ulong)in_stack_fffffffffffff090 >> 0x20));
    booster::locale::basic_message<wchar_t>::str_abi_cxx11_
              ((basic_message<wchar_t> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    std::__cxx11::wstring::operator=(local_318,local_3e0);
    std::__cxx11::wstring::~wstring(local_3e0);
    booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff090);
    test_counter = test_counter + 1;
    _Var2 = std::operator==(in_stack_fffffffffffff0b0,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)in_stack_fffffffffffff0a8);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x57);
      poVar5 = std::operator<<(poVar5," tmp==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_482 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_480,"Error limits reached, stopping unit test",&local_481);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff0a0,(string *)in_stack_fffffffffffff098);
        local_482 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    std::locale::global(&local_490);
    std::locale::~locale(&local_490);
    std::__cxx11::wostringstream::wostringstream(local_608);
    std::wios::imbue(&local_610);
    std::locale::~locale(&local_610);
    booster::locale::translate<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff0a8,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff0a0,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               in_stack_fffffffffffff098,(int)((ulong)in_stack_fffffffffffff090 >> 0x20));
    booster::locale::operator<<
              ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)in_stack_fffffffffffff090,
               in_stack_fffffffffffff088);
    booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff090);
    test_counter = test_counter + 1;
    std::__cxx11::wostringstream::str();
    _Var2 = std::operator==(in_stack_fffffffffffff0b0,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)in_stack_fffffffffffff0a8);
    std::__cxx11::wstring::~wstring(local_6b0);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5d);
      poVar5 = std::operator<<(poVar5," ss.str()==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_6d2 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_6d0,"Error limits reached, stopping unit test",&local_6d1);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff0a0,(string *)in_stack_fffffffffffff098);
        local_6d2 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    std::__cxx11::wostringstream::~wostringstream(local_608);
    std::__cxx11::wstring::~wstring(local_318);
    std::locale::~locale(&local_2f0);
  }
  test_counter = test_counter + 1;
  booster::locale::translate<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff0a8,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff0a0,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff098,(int)((ulong)in_stack_fffffffffffff090 >> 0x20));
  booster::locale::basic_message<wchar_t>::str
            ((basic_message<wchar_t> *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8)
             ,(locale *)in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
  _Var2 = std::operator==(in_stack_fffffffffffff0b0,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)in_stack_fffffffffffff0a8);
  std::__cxx11::wstring::~wstring(local_6f8);
  booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff090);
  if (!_Var2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5f);
    poVar5 = std::operator<<(poVar5," bl::translate(c,s,p,n).str(l,domain)==expected");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_79a = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_798,"Error limits reached, stopping unit test",&local_799);
      booster::runtime_error::runtime_error
                (in_stack_fffffffffffff0a0,(string *)in_stack_fffffffffffff098);
      local_79a = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::locale(&local_7a8);
  std::locale::global(&local_7b0);
  std::locale::~locale(&local_7b0);
  test_counter = test_counter + 1;
  booster::locale::translate<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff0a8,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff0a0,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff098,(int)((ulong)in_stack_fffffffffffff090 >> 0x20));
  booster::locale::basic_message<wchar_t>::str(in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0);
  _Var2 = std::operator==(in_stack_fffffffffffff0b0,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)in_stack_fffffffffffff0a8);
  std::__cxx11::wstring::~wstring(local_7d0);
  booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff090);
  if (!_Var2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x62);
    poVar5 = std::operator<<(poVar5," bl::translate(c,s,p,n).str(domain)==expected");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_872 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_870,"Error limits reached, stopping unit test",&local_871);
      booster::runtime_error::runtime_error
                (in_stack_fffffffffffff0a0,(string *)in_stack_fffffffffffff098);
      local_872 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::global(&local_880);
  std::locale::~locale(&local_880);
  std::__cxx11::wostringstream::wostringstream(local_9f8);
  std::wios::imbue(&local_a00);
  std::locale::~locale(&local_a00);
  booster::locale::as::domain((string *)in_stack_fffffffffffff098);
  booster::locale::as::details::operator<<
            (in_stack_fffffffffffff0c0,
             (set_domain *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
  booster::locale::translate<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff0a8,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff0a0,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff098,(int)((ulong)in_stack_fffffffffffff090 >> 0x20));
  booster::locale::operator<<
            ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)in_stack_fffffffffffff090,
             in_stack_fffffffffffff088);
  booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff090);
  booster::locale::as::details::set_domain::~set_domain((set_domain *)0x11d972);
  test_counter = test_counter + 1;
  std::__cxx11::wostringstream::str();
  _Var2 = std::operator==(in_stack_fffffffffffff0b0,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)in_stack_fffffffffffff0a8);
  std::__cxx11::wstring::~wstring(local_ac0);
  if (!_Var2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x68);
    poVar5 = std::operator<<(poVar5," ss.str()==expected");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_ae2 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      paVar8 = &local_ae1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ae0,"Error limits reached, stopping unit test",paVar8);
      booster::runtime_error::runtime_error
                (in_stack_fffffffffffff0a0,(string *)in_stack_fffffffffffff098);
      local_ae2 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream(local_9f8);
  std::__cxx11::wostringstream::wostringstream(local_c60);
  std::wios::imbue(&local_c68);
  std::locale::~locale(&local_c68);
  booster::locale::as::domain((string *)in_stack_fffffffffffff098);
  booster::locale::as::details::operator<<
            (in_stack_fffffffffffff0c0,
             (set_domain *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::c_str();
  booster::locale::translate<wchar_t>
            ((wchar_t *)in_stack_fffffffffffff0a8,(wchar_t *)in_stack_fffffffffffff0a0,
             &in_stack_fffffffffffff098->n_,(int)((ulong)in_stack_fffffffffffff090 >> 0x20));
  booster::locale::operator<<
            ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)in_stack_fffffffffffff090,
             in_stack_fffffffffffff088);
  booster::locale::basic_message<wchar_t>::~basic_message(in_stack_fffffffffffff090);
  booster::locale::as::details::set_domain::~set_domain((set_domain *)0x11dc93);
  test_counter = test_counter + 1;
  std::__cxx11::wostringstream::str();
  bVar3 = std::operator==(in_stack_fffffffffffff0b0,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)in_stack_fffffffffffff0a8);
  std::__cxx11::wstring::~wstring(local_d28);
  if ((bVar3 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x6e);
    this = (runtime_error *)std::operator<<(poVar5," ss.str()==expected");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      uVar6 = __cxa_allocate_exception(0x30);
      s_00 = (string *)local_d49;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_d49 + 1),"Error limits reached, stopping unit test",
                 (allocator *)s_00);
      booster::runtime_error::runtime_error(this,s_00);
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream(local_c60);
  std::locale::~locale(&local_7a8);
  std::__cxx11::wstring::~wstring(local_118);
  std::__cxx11::wstring::~wstring(local_d0);
  std::__cxx11::wstring::~wstring(local_88);
  std::__cxx11::wstring::~wstring(local_50);
  return;
}

Assistant:

void strings_equal(std::string n_c,std::string n_s,std::string n_p,int n,std::string iexpected,std::locale const &l,std::string domain)
{
    typedef std::basic_string<Char> string_type;
    string_type expected=to_correct_string<Char>(iexpected,l);

    string_type c = to<Char>(n_c.c_str());
    string_type s = to<Char>(n_s.c_str());
    string_type p = to<Char>(n_p.c_str());

    if(domain=="default") {
        TEST(bl::translate(c,s,p,n).str(l)==expected);
        Char const *c_c_str = c.c_str(),*s_c_str=s.c_str(), *p_c_str=p.c_str(); // workaround gcc-3.4 bug
        TEST(bl::translate(c_c_str,s_c_str,p_c_str,n).str(l)==expected);
        std::locale tmp_locale=std::locale();
        std::locale::global(l);
        string_type tmp=bl::translate(c,s,p,n);
        TEST(tmp==expected);
        tmp=bl::translate(c,s,p,n).str();
        TEST(tmp==expected);
        std::locale::global(tmp_locale);

        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::translate(c,s,p,n);
        TEST(ss.str()==expected);
    }
    TEST( bl::translate(c,s,p,n).str(l,domain)==expected );
    std::locale tmp_locale=std::locale();
    std::locale::global(l);
    TEST(bl::translate(c,s,p,n).str(domain)==expected);
    std::locale::global(tmp_locale);
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(c,s,p,n);
        TEST(ss.str()==expected);
    }
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(c.c_str(),s.c_str(),p.c_str(),n);
        TEST(ss.str()==expected);
    }
}